

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_band.c
# Opt level: O0

sunindextype GlobalVectorLength_BandLS(N_Vector y)

{
  N_Vector z;
  realtype rVar1;
  N_Vector tmp;
  realtype len;
  N_Vector y_local;
  
  z = N_VClone(y);
  if (z == (N_Vector)0x0) {
    y_local = (N_Vector)0xffffffffffffffff;
  }
  else {
    N_VConst(1.0,z);
    rVar1 = N_VDotProd(z,z);
    N_VDestroy(z);
    y_local = (N_Vector)(long)rVar1;
  }
  return (sunindextype)y_local;
}

Assistant:

sunindextype GlobalVectorLength_BandLS(N_Vector y)
{
  realtype len;
  N_Vector tmp = NULL;
  tmp = N_VClone(y);
  if (tmp == NULL)  return(-1);
  N_VConst(ONE, tmp);
  len = N_VDotProd(tmp, tmp);
  N_VDestroy(tmp);
  return( (sunindextype) len );
}